

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *v,bool show_full_path)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"[");
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (ulong)((*(long *)(this + 8) - *(long *)this) / 0xd0); uVar2 = uVar2 + 1)
  {
    Path::full_path_name_abi_cxx11_(&local_1d8,(Path *)(*(long *)this + lVar1));
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::_M_dispose();
    if (uVar2 != (*(long *)(this + 8) - *(long *)this) / 0xd0 - 1U) {
      std::operator<<(local_1a8,", ");
    }
    lVar1 = lVar1 + 0xd0;
  }
  std::operator<<(local_1a8,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::vector<Path> &v, bool show_full_path) {
  // TODO(syoyo): indent
  std::stringstream ss;
  ss << "[";

  for (size_t i = 0; i < v.size(); i++) {
    ss << to_string(v[i], show_full_path);
    if (i != (v.size() - 1)) {
      ss << ", ";
    }
  }
  ss << "]";
  return ss.str();
}